

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexer.cxx
# Opt level: O0

yy_state_type yy_get_previous_state(yyscan_t yyscanner)

{
  byte local_29;
  YY_CHAR yy_c;
  yyguts_t *yyg;
  char *yy_cp;
  yy_state_type yy_current_state;
  yyscan_t yyscanner_local;
  
  yy_cp._4_4_ = *(int *)((long)yyscanner + 0x4c);
  for (yyg = *(yyguts_t **)((long)yyscanner + 0x80); yyg < *(yyguts_t **)((long)yyscanner + 0x40);
      yyg = (yyguts_t *)((long)&yyg->yyextra_r + 1)) {
    if (*(char *)&yyg->yyextra_r == '\0') {
      local_29 = 1;
    }
    else {
      local_29 = ""[*(byte *)&yyg->yyextra_r];
    }
    if (yy_accept[yy_cp._4_4_] != 0) {
      *(int *)((long)yyscanner + 0x68) = yy_cp._4_4_;
      *(yyguts_t **)((long)yyscanner + 0x70) = yyg;
    }
    while (yy_chk[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_29)] != yy_cp._4_4_) {
      yy_cp._4_4_ = (int)yy_def[yy_cp._4_4_];
      if (0x1e < yy_cp._4_4_) {
        local_29 = ""[local_29];
      }
    }
    yy_cp._4_4_ = (int)yy_nxt[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_29)];
  }
  return yy_cp._4_4_;
}

Assistant:

static yy_state_type yy_get_previous_state (yyscan_t yyscanner)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_current_state = yyg->yy_start;

	for ( yy_cp = yyg->yytext_ptr + YY_MORE_ADJ; yy_cp < yyg->yy_c_buf_p; ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			yyg->yy_last_accepting_state = yy_current_state;
			yyg->yy_last_accepting_cpos = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 29 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}